

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglcompositorbackingstore.cpp
# Opt level: O2

void __thiscall
QOpenGLCompositorBackingStore::resize
          (QOpenGLCompositorBackingStore *this,QSize *size,QRegion *staticContents)

{
  QSurface *pQVar1;
  QOpenGLCompositor *pQVar2;
  long in_FS_OFFSET;
  QImage aQStack_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QOpenGLCompositor::instance();
  pQVar1 = (QSurface *)pQVar2->m_context;
  if ((pQVar1 != (QSurface *)0x0) && (pQVar2->m_targetWindow != (QWindow *)0x0)) {
    QImage::QImage(aQStack_48,size,Format_RGBA8888);
    QImage::operator=(&this->m_image,aQStack_48);
    QImage::~QImage(aQStack_48);
    QWindow::create();
    QOpenGLContext::makeCurrent(pQVar1);
    if (this->m_bsTexture != 0) {
      if (this->m_bsTextureWrapper != (QRhiTexture *)0x0) {
        (**(code **)(*(long *)this->m_bsTextureWrapper + 8))();
      }
      this->m_bsTextureWrapper = (QRhiTexture *)0x0;
      glDeleteTextures(1,&this->m_bsTexture);
      this->m_bsTexture = 0;
      this->m_bsTextureContext = (QOpenGLContext *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLCompositorBackingStore::resize(const QSize &size, const QRegion &staticContents)
{
    Q_UNUSED(staticContents);

    QOpenGLCompositor *compositor = QOpenGLCompositor::instance();
    QOpenGLContext *dstCtx = compositor->context();
    if (!dstCtx)
        return;
    QWindow *dstWin = compositor->targetWindow();
    if (!dstWin)
        return;

    m_image = QImage(size, QImage::Format_RGBA8888);

    m_window->create();

    dstCtx->makeCurrent(dstWin);
    if (m_bsTexture) {
        delete m_bsTextureWrapper;
        m_bsTextureWrapper = nullptr;
        glDeleteTextures(1, &m_bsTexture);
        m_bsTexture = 0;
        m_bsTextureContext = nullptr;
    }
}